

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_ND_C.cpp
# Opt level: O2

void amrex::EB2::intercept_to_edge_centroid
               (Array4<double> *excent,Array4<double> *eycent,Array4<double> *ezcent,
               Array4<const_unsigned_int> *fx,Array4<const_unsigned_int> *fy,
               Array4<const_unsigned_int> *fz,Array4<const_double> *levset,GpuArray<double,_3U> *dx,
               GpuArray<double,_3U> *problo)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  uint *puVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  Box local_4c;
  
  dVar28 = dx->arr[0];
  dVar1 = dx->arr[1];
  dVar2 = dx->arr[2];
  Box::Box<double>(&local_4c,excent);
  lVar17 = (long)local_4c.smallend.vect[0];
  for (lVar16 = (long)local_4c.smallend.vect[2]; lVar22 = (long)local_4c.smallend.vect[1],
      (int)lVar16 <= local_4c.bigend.vect[2]; lVar16 = lVar16 + 1) {
    for (; (int)lVar22 <= local_4c.bigend.vect[1]; lVar22 = lVar22 + 1) {
      lVar12 = (long)(levset->begin).y;
      pdVar6 = levset->p;
      lVar23 = levset->jstride;
      lVar18 = (long)(levset->begin).z;
      lVar7 = levset->kstride;
      iVar24 = (fx->begin).y;
      iVar10 = (levset->begin).x;
      lVar20 = (lVar16 - (excent->begin).z) * excent->kstride;
      iVar3 = (fx->begin).z;
      lVar14 = (lVar22 - (excent->begin).y) * excent->jstride;
      lVar15 = (long)(excent->begin).x;
      pdVar8 = excent->p;
      lVar13 = fx->kstride;
      lVar11 = fx->jstride;
      iVar4 = (fx->begin).x;
      puVar9 = fx->p;
      for (lVar25 = 0; lVar17 + lVar25 <= (long)local_4c.bigend.vect[0]; lVar25 = lVar25 + 1) {
        dVar27 = 1.0;
        if (puVar9[lVar17 + (((lVar16 - iVar3) * lVar13 + (lVar22 - iVar24) * lVar11 + lVar25) -
                            (long)iVar4)] != 0) {
          if (puVar9[lVar17 + (((lVar16 - iVar3) * lVar13 + (lVar22 - iVar24) * lVar11 + lVar25) -
                              (long)iVar4)] == 1) {
            dVar27 = -1.0;
          }
          else {
            uVar26 = -(ulong)(pdVar6[lVar17 + (((lVar16 - lVar18) * lVar7 +
                                               (lVar22 - lVar12) * lVar23 + lVar25) - (long)iVar10)]
                             < pdVar6[((int)lVar22 - lVar12) * lVar23 +
                                      ((int)lVar16 - lVar18) * lVar7 +
                                      (long)(((local_4c.smallend.vect[0] + 1) - iVar10) +
                                            (int)lVar25)]);
            dVar27 = (pdVar8[lVar17 + ((lVar20 + lVar14 + lVar25) - lVar15)] -
                     ((double)(local_4c.smallend.vect[0] + (int)lVar25) * dx->arr[0] +
                     problo->arr[0])) * 0.5 * (1.0 / dVar28);
            dVar27 = (double)((ulong)(dVar27 + -0.5) & uVar26 | ~uVar26 & (ulong)dVar27);
            if (dVar27 <= -0.5) {
              dVar27 = -0.5;
            }
            if (0.5 <= dVar27) {
              dVar27 = 0.5;
            }
          }
        }
        pdVar8[lVar17 + ((lVar20 + lVar14 + lVar25) - lVar15)] = dVar27;
      }
    }
  }
  Box::Box<double>(&local_4c,eycent);
  lVar16 = (long)local_4c.smallend.vect[0];
  for (lVar17 = (long)local_4c.smallend.vect[2]; lVar22 = (long)local_4c.smallend.vect[1],
      iVar24 = local_4c.smallend.vect[1], (int)lVar17 <= local_4c.bigend.vect[2];
      lVar17 = lVar17 + 1) {
    while( true ) {
      iVar24 = iVar24 + 1;
      iVar10 = (int)lVar22;
      if (local_4c.bigend.vect[1] < iVar10) break;
      iVar3 = (levset->begin).y;
      lVar20 = lVar22 - iVar3;
      lVar18 = levset->jstride * 8;
      lVar12 = (lVar17 - (levset->begin).z) * levset->kstride;
      lVar25 = (long)(levset->begin).x;
      pdVar6 = levset->p;
      lVar19 = (lVar17 - (eycent->begin).z) * eycent->kstride;
      lVar14 = (lVar22 - (eycent->begin).y) * eycent->jstride;
      iVar4 = (fy->begin).z;
      lVar15 = (long)(eycent->begin).x;
      pdVar8 = eycent->p;
      lVar23 = lVar22 + 1;
      lVar7 = fy->kstride;
      lVar11 = lVar22 - (fy->begin).y;
      lVar13 = fy->jstride;
      iVar5 = (fy->begin).x;
      puVar9 = fy->p;
      for (lVar21 = 0; lVar22 = lVar23, lVar16 + lVar21 <= (long)local_4c.bigend.vect[0];
          lVar21 = lVar21 + 1) {
        dVar28 = 1.0;
        if (puVar9[lVar16 + (((lVar17 - iVar4) * lVar7 + lVar11 * lVar13 + lVar21) - (long)iVar5)]
            != 0) {
          if (puVar9[lVar16 + (((lVar17 - iVar4) * lVar7 + lVar11 * lVar13 + lVar21) - (long)iVar5)]
              == 1) {
            dVar28 = -1.0;
          }
          else {
            uVar26 = -(ulong)(*(double *)
                               ((long)pdVar6 +
                               lVar21 * 8 + lVar20 * lVar18 + lVar12 * 8 + lVar25 * -8 + lVar16 * 8)
                             < *(double *)
                                ((long)pdVar6 +
                                lVar21 * 8 +
                                (iVar24 - iVar3) * lVar18 + lVar12 * 8 + lVar25 * -8 + lVar16 * 8));
            dVar28 = (pdVar8[lVar16 + ((lVar19 + lVar14 + lVar21) - lVar15)] -
                     (dx->arr[1] * (double)iVar10 + problo->arr[1])) * 0.5 * (1.0 / dVar1);
            dVar28 = (double)((ulong)(dVar28 + -0.5) & uVar26 | ~uVar26 & (ulong)dVar28);
            if (dVar28 <= -0.5) {
              dVar28 = -0.5;
            }
            if (0.5 <= dVar28) {
              dVar28 = 0.5;
            }
          }
        }
        pdVar8[lVar16 + ((lVar19 + lVar14 + lVar21) - lVar15)] = dVar28;
      }
    }
  }
  Box::Box<double>(&local_4c,ezcent);
  lVar17 = (long)local_4c.smallend.vect[0];
  lVar16 = (long)local_4c.smallend.vect[2];
  while( true ) {
    lVar22 = lVar16;
    local_4c.smallend.vect[2] = local_4c.smallend.vect[2] + 1;
    if (local_4c.bigend.vect[2] < (int)lVar22) break;
    for (lVar23 = (long)local_4c.smallend.vect[1]; lVar16 = lVar22 + 1,
        (int)lVar23 <= local_4c.bigend.vect[1]; lVar23 = lVar23 + 1) {
      iVar24 = (fz->begin).y;
      iVar10 = (levset->begin).z;
      lVar14 = levset->kstride * 8;
      lVar13 = (lVar23 - (levset->begin).y) * levset->jstride;
      lVar11 = (long)(levset->begin).x;
      pdVar6 = levset->p;
      lVar12 = (lVar22 - (ezcent->begin).z) * ezcent->kstride;
      iVar3 = (fz->begin).z;
      lVar15 = (lVar23 - (ezcent->begin).y) * ezcent->jstride;
      lVar18 = (long)(ezcent->begin).x;
      pdVar8 = ezcent->p;
      lVar16 = fz->kstride;
      lVar7 = fz->jstride;
      iVar4 = (fz->begin).x;
      puVar9 = fz->p;
      for (lVar20 = 0; lVar17 + lVar20 <= (long)local_4c.bigend.vect[0]; lVar20 = lVar20 + 1) {
        dVar28 = 1.0;
        if (puVar9[lVar17 + (((lVar22 - iVar3) * lVar16 + (lVar23 - iVar24) * lVar7 + lVar20) -
                            (long)iVar4)] != 0) {
          if (puVar9[lVar17 + (((lVar22 - iVar3) * lVar16 + (lVar23 - iVar24) * lVar7 + lVar20) -
                              (long)iVar4)] == 1) {
            dVar28 = -1.0;
          }
          else {
            uVar26 = -(ulong)(*(double *)
                               ((long)pdVar6 +
                               lVar20 * 8 +
                               (lVar22 - iVar10) * lVar14 + lVar13 * 8 + lVar11 * -8 + lVar17 * 8) <
                             *(double *)
                              ((long)pdVar6 +
                              lVar20 * 8 +
                              (local_4c.smallend.vect[2] - iVar10) * lVar14 + lVar13 * 8 +
                              lVar11 * -8 + lVar17 * 8));
            dVar28 = (pdVar8[lVar17 + ((lVar12 + lVar15 + lVar20) - lVar18)] -
                     (dx->arr[2] * (double)(int)lVar22 + problo->arr[2])) * 0.5 * (1.0 / dVar2);
            dVar28 = (double)((ulong)(dVar28 + -0.5) & uVar26 | ~uVar26 & (ulong)dVar28);
            if (dVar28 <= -0.5) {
              dVar28 = -0.5;
            }
            if (0.5 <= dVar28) {
              dVar28 = 0.5;
            }
          }
        }
        pdVar8[lVar17 + ((lVar12 + lVar15 + lVar20) - lVar18)] = dVar28;
      }
    }
  }
  return;
}

Assistant:

void intercept_to_edge_centroid (AMREX_D_DECL(Array4<Real> const& excent,
                                              Array4<Real> const& eycent,
                                              Array4<Real> const& ezcent),
                                 AMREX_D_DECL(Array4<Type_t const> const& fx,
                                              Array4<Type_t const> const& fy,
                                              Array4<Type_t const> const& fz),
                                 Array4<Real const> const& levset,
                                 GpuArray<Real,AMREX_SPACEDIM> const& dx,
                                 GpuArray<Real,AMREX_SPACEDIM> const& problo) noexcept
{
    AMREX_D_TERM(const Real dxinv = Real(1.0)/dx[0];,
                 const Real dyinv = Real(1.0)/dx[1];,
                 const Real dzinv = Real(1.0)/dx[2];)
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
        Box(excent), xbx, {
            AMREX_LOOP_3D(xbx, i, j, k, {
                if (fx(i,j,k) == Type::regular) {
                    excent(i,j,k) = Real(1.0);
                } else if (fx(i,j,k) == Type::covered) {
                    excent(i,j,k) = Real(-1.0);
                } else {
                    Real xcut = Real(0.5)*(excent(i,j,k) - (problo[0]+i*dx[0]))*dxinv;
                    if (levset(i,j,k) < levset(i+1,j,k)) { // right side covered
                        xcut -= Real(0.5);
                    }
                    excent(i,j,k) = amrex::min(Real(0.5),amrex::max(Real(-0.5),xcut));
                }